

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegd_parser.c
# Opt level: O2

MPP_RET jpegd_prepare(void *ctx,MppPacket pkt,HalDecTask *task)

{
  uint uVar1;
  void *__src;
  size_t sVar2;
  RK_S64 RVar3;
  void *pvVar4;
  char *fname;
  ulong uVar5;
  char *fmt;
  ulong uVar6;
  char cVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 uVar11;
  MppPacket local_48;
  
  uVar11 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"jpegd_parser","enter\n","jpegd_prepare");
  }
  if (*(int *)((long)ctx + 0x48) == 0) {
    *(MppPacket *)((long)ctx + 0x28) = pkt;
    local_48 = pkt;
  }
  else {
    local_48 = *(MppPacket *)((long)ctx + 0x28);
  }
  __src = mpp_packet_get_pos(pkt);
  sVar2 = mpp_packet_get_length(pkt);
  uVar9 = (uint)sVar2;
  if (uVar9 == 0) {
    uVar1 = 1;
  }
  else {
    uVar1 = mpp_packet_get_eos(pkt);
  }
  RVar3 = mpp_packet_get_pts(pkt);
  *(RK_S64 *)((long)ctx + 0x38) = RVar3;
  task->valid = 0;
  (task->flags).val = (task->flags).val & 0xfffffffffffffffe | (ulong)(uVar1 & 1);
  *(uint *)((long)ctx + 0x40) = uVar1;
  if ((jpegd_debug & 0x20) != 0) {
    _mpp_log_l(4,"jpegd_parser","pkt_length %d eos %d\n",(char *)0x0,sVar2 & 0xffffffff,(ulong)uVar1
              );
  }
  if (uVar9 == 0) {
    if ((jpegd_debug & 0x20) != 0) {
      fmt = "it is end of stream.";
      fname = (char *)0x0;
      goto LAB_001b0b41;
    }
  }
  else {
    uVar1 = *(uint *)((long)ctx + 0x24);
    if (uVar1 < uVar9) {
      if ((jpegd_debug & 0x20) != 0) {
        _mpp_log_l(4,"jpegd_parser","Huge Frame(%d Bytes)! bufferSize:%d",(char *)0x0,
                   sVar2 & 0xffffffff,(ulong)uVar1);
      }
      mpp_osal_free("jpegd_prepare",*(void **)((long)ctx + 0x18));
      *(undefined8 *)((long)ctx + 0x18) = 0;
      uVar1 = uVar9 + 0x400;
      pvVar4 = mpp_osal_calloc("jpegd_prepare",(ulong)uVar1);
      *(void **)((long)ctx + 0x18) = pvVar4;
      if (pvVar4 == (void *)0x0) {
        _mpp_log_l(2,"jpegd_parser","no memory!","jpegd_prepare");
        return MPP_ERR_NOMEM;
      }
      *(uint *)((long)ctx + 0x24) = uVar1;
    }
    if (*(int *)((long)ctx + 0x48) == 0) {
      uVar1 = 0;
    }
    else {
      pvVar4 = *(void **)((long)ctx + 0x18);
      if ((jpegd_debug & 1) != 0) {
        _mpp_log_l(4,"jpegd_parser","enter\n","jpegd_split_frame");
      }
      if (__src == (void *)0x0 || pvVar4 == (void *)0x0) {
        uVar1 = 0;
        _mpp_log_l(2,"jpegd_parser","NULL pointer or wrong src_size(%d)","jpegd_split_frame",
                   sVar2 & 0xffffffff);
      }
      else {
        if ((((*(char *)((long)__src + 6) == 'A') && (*(char *)((long)__src + 7) == 'V')) &&
            (*(char *)((long)__src + 8) == 'I')) && (*(char *)((long)__src + 9) == '1')) {
          if ((jpegd_debug & 0x20) != 0) {
            _mpp_log_l(4,"jpegd_parser","distinguish 310 from 210 camera",(char *)0x0);
          }
          uVar8 = 0;
          uVar6 = 0;
          while (uVar1 = (uint)uVar6, uVar1 < uVar9 - 4) {
            cVar7 = *(char *)((long)__src + uVar6);
            if (((cVar7 == -1) && (cVar7 = -1, *(char *)(uVar6 + 1 + (long)__src) == '\0')) &&
               (*(char *)((long)__src + (ulong)(uVar1 + 2)) == -1)) {
              uVar5 = (ulong)(uVar1 + 2);
              if ((*(byte *)((long)__src + (ulong)(uVar1 + 3)) & 0xf0) != 0xd0) {
                uVar5 = uVar6;
              }
              cVar7 = *(char *)((long)__src + uVar5);
              uVar1 = (uint)uVar5;
            }
            *(char *)((long)pvVar4 + uVar8) = cVar7;
            uVar8 = uVar8 + 1;
            uVar6 = (ulong)(uVar1 + 1);
          }
          for (; uVar6 < (sVar2 & 0xffffffff); uVar6 = uVar6 + 1) {
            *(undefined1 *)((long)pvVar4 + uVar8) = *(undefined1 *)((long)__src + uVar6);
            uVar8 = uVar8 + 1;
          }
          if ((uint)uVar8 < uVar9) {
            memset((void *)((long)pvVar4 + uVar8),0,(ulong)(uVar9 - (uint)uVar8));
          }
        }
        else {
          uVar10 = uVar9 + 0xff & 0xffffff00;
          memcpy(pvVar4,__src,sVar2 & 0xffffffff);
          if (uVar1 <= uVar10) {
            uVar10 = uVar1;
          }
          memset((void *)((long)pvVar4 + (sVar2 & 0xffffffff)),0,(ulong)(uVar10 - uVar9));
          uVar8 = sVar2 & 0xffffffff;
        }
        uVar1 = (uint)uVar8;
        if ((jpegd_debug & 1) != 0) {
          _mpp_log_l(4,"jpegd_parser","exit\n","jpegd_split_frame");
        }
      }
    }
    uVar8 = sVar2 & 0xffffffff;
    mpp_packet_set_pos(pkt,(void *)((long)__src + uVar8));
    if ((jpegd_debug & 0x20) != 0 && uVar1 != uVar9) {
      _mpp_log_l(4,"jpegd_parser","packet prepare, pkt_length:%d, copy_length:%d\n",(char *)0x0,
                 sVar2 & 0xffffffff,(ulong)uVar1);
    }
    if ((jpegd_debug & 0x10) != 0) {
      snprintf(jpegd_prepare::name,0x1f,"/data/input%02d.jpg");
      jpegd_prepare::jpg_file = (FILE *)fopen(jpegd_prepare::name,"wb+");
      if ((FILE *)jpegd_prepare::jpg_file != (FILE *)0x0) {
        if ((jpegd_debug & 0x10) != 0) {
          uVar11 = 0;
          _mpp_log_l(4,"jpegd_parser","frame_%02d input jpeg(%d Bytes) saving to %s\n",(char *)0x0,
                     (ulong)*(uint *)((long)ctx + 0x44),sVar2 & 0xffffffff,jpegd_prepare::name);
        }
        fwrite(__src,uVar8,1,(FILE *)jpegd_prepare::jpg_file);
        fclose((FILE *)jpegd_prepare::jpg_file);
        *(int *)((long)ctx + 0x44) = *(int *)((long)ctx + 0x44) + 1;
      }
    }
    if (*(int *)((long)ctx + 0x48) != 0) {
      mpp_packet_set_data(local_48,*(void **)((long)ctx + 0x18));
      mpp_packet_set_size(local_48,uVar8);
      mpp_packet_set_length(local_48,uVar8);
      memcpy(__src,*(void **)((long)ctx + 0x18),uVar8);
    }
    *(uint *)((long)ctx + 0x20) = uVar9;
    task->input_packet = local_48;
    task->valid = 1;
    if ((jpegd_debug & 0x20) != 0) {
      _mpp_log_l(4,"jpegd_parser","input_packet:%p, recv_buffer:%p, pkt_length:%d",(char *)0x0,
                 local_48,*(undefined8 *)((long)ctx + 0x18),CONCAT44(uVar11,uVar9));
    }
    if ((jpegd_debug & 1) != 0) {
      fmt = "exit\n";
      fname = "jpegd_prepare";
LAB_001b0b41:
      _mpp_log_l(4,"jpegd_parser",fmt,fname);
      return MPP_OK;
    }
  }
  return MPP_OK;
}

Assistant:

static MPP_RET jpegd_prepare(void *ctx, MppPacket pkt, HalDecTask *task)
{
    jpegd_dbg_func("enter\n");
    MPP_RET ret = MPP_OK;
    JpegdCtx *JpegCtx = (JpegdCtx *)ctx;
    if (!JpegCtx->copy_flag) {
        /* no need to copy stream, handle packet from upper application directly*/
        JpegCtx->input_packet = pkt;
    }

    MppPacket input_packet = JpegCtx->input_packet;
    RK_U32 copy_length = 0;
    void *base = mpp_packet_get_pos(pkt);
    RK_U8 *pos = base;
    RK_U32 pkt_length = (RK_U32)mpp_packet_get_length(pkt);
    RK_U32 eos = (pkt_length) ? (mpp_packet_get_eos(pkt)) : (1);

    JpegCtx->pts = mpp_packet_get_pts(pkt);

    task->valid = 0;
    task->flags.eos = eos;
    JpegCtx->eos = eos;

    jpegd_dbg_parser("pkt_length %d eos %d\n", pkt_length, eos);

    if (!pkt_length) {
        jpegd_dbg_parser("it is end of stream.");
        return ret;
    }

    if (pkt_length > JpegCtx->bufferSize) {
        jpegd_dbg_parser("Huge Frame(%d Bytes)! bufferSize:%d",
                         pkt_length, JpegCtx->bufferSize);
        mpp_free(JpegCtx->recv_buffer);
        JpegCtx->recv_buffer = NULL;

        JpegCtx->recv_buffer = mpp_calloc(RK_U8, pkt_length + 1024);
        if (NULL == JpegCtx->recv_buffer) {
            mpp_err_f("no memory!");
            return MPP_ERR_NOMEM;
        }

        JpegCtx->bufferSize = pkt_length + 1024;
    }

    if (JpegCtx->copy_flag)
        jpegd_split_frame(base, pkt_length, JpegCtx->recv_buffer,
                          JpegCtx->bufferSize, &copy_length);

    pos += pkt_length;
    mpp_packet_set_pos(pkt, pos);
    if (copy_length != pkt_length) {
        jpegd_dbg_parser("packet prepare, pkt_length:%d, copy_length:%d\n",
                         pkt_length, copy_length);
    }

    /* debug information */
    if (jpegd_debug & JPEGD_DBG_IO) {
        static FILE *jpg_file;
        static char name[32];

        snprintf(name, sizeof(name) - 1, "/data/input%02d.jpg",
                 JpegCtx->input_jpeg_count);
        jpg_file = fopen(name, "wb+");
        if (jpg_file) {
            jpegd_dbg_io("frame_%02d input jpeg(%d Bytes) saving to %s\n",
                         JpegCtx->input_jpeg_count, pkt_length, name);
            fwrite(base, pkt_length, 1, jpg_file);
            fclose(jpg_file);
            JpegCtx->input_jpeg_count++;
        }
    }

    if (JpegCtx->copy_flag) {
        mpp_packet_set_data(input_packet, JpegCtx->recv_buffer);
        mpp_packet_set_size(input_packet, pkt_length);
        mpp_packet_set_length(input_packet, pkt_length);
        memcpy(base, JpegCtx->recv_buffer, pkt_length);
    }

    JpegCtx->streamLength = pkt_length;
    task->input_packet = input_packet;
    task->valid = 1;
    jpegd_dbg_parser("input_packet:%p, recv_buffer:%p, pkt_length:%d",
                     input_packet,
                     JpegCtx->recv_buffer, pkt_length);

    jpegd_dbg_func("exit\n");
    return ret;
}